

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::
ASTVisitor<always_ff_assignment_outside_conditional::AlwaysFFVisitor,_true,_true,_false,_false>::
visitDefault<slang::ast::StructuredAssignmentPatternExpression>
          (ASTVisitor<always_ff_assignment_outside_conditional::AlwaysFFVisitor,_true,_true,_false,_false>
           *this,StructuredAssignmentPatternExpression *t)

{
  AlwaysFFVisitor *in_stack_00000048;
  StructuredAssignmentPatternExpression *in_stack_00000050;
  
  StructuredAssignmentPatternExpression::
  visitExprs<always_ff_assignment_outside_conditional::AlwaysFFVisitor&>
            (in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }